

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O1

int Sfm_LibFindAreaMatch(Sfm_Lib_t *p,word *pTruth,int nFanins,int *piObj)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  Sfm_Fun_t *pSVar4;
  long lVar5;
  
  puVar3 = (uint *)Vec_MemHashLookup(p->vTtMem,pTruth);
  uVar1 = *puVar3;
  if ((ulong)uVar1 == 0xffffffff) {
    iVar2 = -1;
  }
  else {
    if (((int)uVar1 < 0) || ((p->vLists).nSize <= (int)uVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    lVar5 = (long)(p->vLists).pArray[uVar1];
    if (lVar5 == -1) {
      pSVar4 = (Sfm_Fun_t *)0x0;
    }
    else {
      pSVar4 = p->pObjs + lVar5;
    }
    if (piObj != (int *)0x0) {
      *piObj = (int)((ulong)((long)pSVar4 - (long)p->pObjs) >> 2) * -0x49249249;
    }
    iVar2 = pSVar4->Area;
  }
  return iVar2;
}

Assistant:

int Sfm_LibFindAreaMatch( Sfm_Lib_t * p, word * pTruth, int nFanins, int * piObj )
{
    Sfm_Fun_t * pObj = NULL;
    int iFunc = *Vec_MemHashLookup( p->vTtMem,  pTruth );
    if ( iFunc == -1 )
        return -1;
    Sfm_LibForEachSuper( p, pObj, iFunc )
        break;
    if ( piObj )
        *piObj = pObj - p->pObjs;
    return pObj->Area;
}